

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

float __thiscall options::value<float>(options *this,char *s)

{
  mapped_type *pmVar1;
  allocator<char> local_1c5;
  float local_1c4;
  float v;
  unique_lock<std::mutex> lock;
  istringstream ss;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->m);
  std::__cxx11::string::string<std::allocator<char>>((string *)&v,s,&local_1c5);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->opts,(key_type *)&v);
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)pmVar1,_S_in);
  std::__cxx11::string::~string((string *)&v);
  std::istream::_M_extract<float>((float *)&ss);
  local_1c4 = v;
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return local_1c4;
}

Assistant:

inline T value(const char* s) {
		std::unique_lock<std::mutex> lock(m);
		std::istringstream ss{ opts[std::string{s}] };
		T v;
		ss >> v;
		return v;
	}